

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chars.cpp
# Opt level: O3

BuiltinFunction *
char_predicate(BuiltinFunction *__return_storage_ptr__,string *name,_func_int_int *fun)

{
  string *psVar1;
  BuiltinFunction *pBVar2;
  BuiltinFunction *extraout_RAX;
  undefined8 in_RCX;
  long *local_48;
  long local_40;
  long local_38 [2];
  undefined8 local_28;
  
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,name,fun + (long)name);
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  ).
  super__Tuple_impl<1UL,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  .
  super__Tuple_impl<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  .
  super__Head_base<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>,_false>
  ._M_head_impl.super__Function_base._M_manager = (_Manager_type)0x0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  ).
  super__Tuple_impl<1UL,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  .
  super__Tuple_impl<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  .
  super__Head_base<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>,_false>
  ._M_head_impl._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)
   &(__return_storage_ptr__->
    super__Tuple_impl<0UL,_long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
    ).
    super__Tuple_impl<1UL,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
    .
    super__Tuple_impl<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
    .
    super__Head_base<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>,_false>
    ._M_head_impl.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super__Tuple_impl<0UL,_long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
           ).
           super__Tuple_impl<1UL,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
           .
           super__Tuple_impl<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
           .
           super__Head_base<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>,_false>
           ._M_head_impl.super__Function_base._M_functor + 8) = 0;
  local_28 = in_RCX;
  psVar1 = (string *)operator_new(0x28);
  *(string **)psVar1 = psVar1 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar1,local_48,local_40 + (long)local_48);
  *(undefined8 *)(psVar1 + 0x20) = local_28;
  *(string **)
   &(__return_storage_ptr__->
    super__Tuple_impl<0UL,_long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
    ).
    super__Tuple_impl<1UL,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
    .
    super__Tuple_impl<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
    .
    super__Head_base<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>,_false>
    ._M_head_impl.super__Function_base._M_functor = psVar1;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  ).
  super__Tuple_impl<1UL,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  .
  super__Tuple_impl<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  .
  super__Head_base<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>,_false>
  ._M_head_impl._M_invoker =
       std::
       _Function_handler<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kalinochkind[P]scheme/src/std/builtins/chars.cpp:6:19)>
       ::_M_invoke;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  ).
  super__Tuple_impl<1UL,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  .
  super__Tuple_impl<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  .
  super__Head_base<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>,_false>
  ._M_head_impl.super__Function_base._M_manager =
       std::
       _Function_handler<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kalinochkind[P]scheme/src/std/builtins/chars.cpp:6:19)>
       ::_M_manager;
  pBVar2 = (BuiltinFunction *)0x1;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  ).
  super__Tuple_impl<1UL,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  .super__Head_base<1UL,_long_long,_false>._M_head_impl = 1;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  ).super__Head_base<0UL,_long_long,_false>._M_head_impl = 1;
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
    pBVar2 = extraout_RAX;
  }
  return pBVar2;
}

Assistant:

static BuiltinFunction char_predicate(const std::string &name, int (*fun)(int))
{
    return {1, 1, [name, fun](const std::list<std::shared_ptr<SchemeObject>> &l) {
        auto p = std::dynamic_pointer_cast<SchemeChar>(l.front());
        if(!p)
            throw eval_error(name + ": a char required");
        return fun(p->value) ? scheme_true : scheme_false;
    }};
}